

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fuse_innerproduct_batchnorm(NetOptimize *this)

{
  float fVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  long lVar7;
  pointer pMVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  pointer pMVar14;
  size_type sVar15;
  ulong uVar16;
  size_type sVar17;
  size_type __n;
  long lVar18;
  ulong uVar19;
  float fVar20;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  Mat local_a8;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar18 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar18 != 0) {
    uVar19 = lVar18 >> 3;
    lVar18 = 0;
    do {
      iVar10 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar18]->type);
      if (iVar10 == 0) {
        uVar16 = lVar18 + 1;
        if (uVar16 < uVar19) {
          iVar10 = *((((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar18]->tops).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          do {
            iVar11 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar16]->type);
            if (((iVar11 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar16],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 == 4)) && (*piVar4 == iVar10)
               ) goto LAB_00165480;
            uVar16 = uVar16 + 1;
          } while (uVar16 < uVar19);
        }
        else {
LAB_00165480:
          if (uVar16 != uVar19) {
            ppLVar5 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[lVar18];
            pLVar6 = ppLVar5[uVar16];
            fprintf(_stderr,"fuse_innerproduct_batchnorm %s %s\n",(pLVar3->name)._M_dataplus._M_p,
                    (pLVar6->name)._M_dataplus._M_p);
            iVar10 = *(int *)&pLVar6[1]._vptr_Layer;
            __n = (size_type)iVar10;
            fVar1 = *(float *)((long)&pLVar6[1]._vptr_Layer + 4);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_48,__n,(allocator_type *)&local_a8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_60,__n,(allocator_type *)&local_a8);
            if (0 < iVar10) {
              sVar17 = 0;
              do {
                fVar20 = (float)pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage[sVar17] + fVar1;
                if (fVar20 < 0.0) {
                  fVar20 = sqrtf(fVar20);
                }
                else {
                  fVar20 = SQRT(fVar20);
                }
                lVar7 = *(long *)&pLVar6[1].one_blob_only;
                local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[sVar17] =
                     *(float *)(*(long *)&pLVar6[2].support_tensor_storage + sVar17 * 4) -
                     (*(float *)(lVar7 + sVar17 * 4) *
                     *(float *)(pLVar6[1].name._M_dataplus._M_p + sVar17 * 4)) / fVar20;
                local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[sVar17] = *(float *)(lVar7 + sVar17 * 4) / fVar20;
                sVar17 = sVar17 + 1;
              } while (__n != sVar17);
            }
            if (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0) {
              *(undefined4 *)((long)&pLVar3[1]._vptr_Layer + 4) = 1;
              local_a8.cstep = 0;
              local_a8.data = (pointer)0x0;
              local_a8.refcount._0_4_ = 0;
              local_a8.refcount._4_4_ = 0;
              local_a8.elemsize._0_4_ = 0;
              local_a8.elemsize._4_4_ = 0;
              local_a8.elempack = 0;
              local_a8.h = 0;
              local_a8.d = 0;
              local_a8.c = 0;
              local_a8.allocator = (Allocator *)0x0;
              local_a8.dims = 0;
              local_a8.w = 0;
              ncnn::Mat::create(&local_a8,iVar10,4,(Allocator *)0x0);
              pMVar14 = (pointer)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
              if ((Mat *)&pLVar3[1].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish != &local_a8) {
                if (pMVar14 != (pointer)0x0) {
                  LOCK();
                  *(int *)&pMVar14->data = *(int *)&pMVar14->data + 1;
                  UNLOCK();
                }
                pMVar14 = pLVar3[1].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
                if (pMVar14 != (pointer)0x0) {
                  LOCK();
                  *(int *)&pMVar14->data = *(int *)&pMVar14->data + -1;
                  UNLOCK();
                  if (*(int *)&pMVar14->data == 0) {
                    pMVar14 = pLVar3[1].bottom_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                    pMVar8 = pLVar3[1].top_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
                    if (pMVar8 == (pointer)0x0) {
                      if (pMVar14 != (pointer)0x0) {
                        free(pMVar14);
                      }
                    }
                    else {
                      (**(code **)((long)pMVar8->data + 0x18))();
                    }
                  }
                }
                uVar9 = local_a8._52_8_;
                pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)local_a8.data;
                pMVar14 = (pointer)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
                pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = pMVar14;
                *(ulong *)&pLVar3[1].top_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data =
                     CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
                *(int *)&pLVar3[1].top_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_a8.elempack;
                pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a8.allocator;
                *(int *)&pLVar3[2]._vptr_Layer = local_a8.dims;
                *(int *)((long)&pLVar3[2]._vptr_Layer + 4) = local_a8.w;
                pLVar3[2].one_blob_only = (bool)(undefined1)local_a8.h;
                pLVar3[2].support_inplace = (bool)local_a8.h._1_1_;
                pLVar3[2].support_vulkan = (bool)local_a8.h._2_1_;
                pLVar3[2].support_packing = (bool)local_a8.h._3_1_;
                pLVar3[2].support_bf16_storage = (bool)(undefined1)local_a8.d;
                pLVar3[2].support_fp16_storage = (bool)local_a8.d._1_1_;
                pLVar3[2].support_int8_storage = (bool)local_a8.d._2_1_;
                pLVar3[2].support_image_storage = (bool)local_a8.d._3_1_;
                local_a8.c = SUB84(uVar9,4);
                pLVar3[2].support_tensor_storage = (bool)(undefined1)local_a8.c;
                pLVar3[2].support_reserved_00 = (bool)local_a8.c._1_1_;
                pLVar3[2].support_reserved_0 = (bool)local_a8.c._2_1_;
                pLVar3[2].support_reserved_1 = (bool)local_a8.c._3_1_;
                pLVar3[2].support_reserved_6 = (bool)(undefined1)local_a8.cstep;
                pLVar3[2].support_reserved_7 = (bool)local_a8.cstep._1_1_;
                pLVar3[2].support_reserved_8 = (bool)local_a8.cstep._2_1_;
                pLVar3[2].support_reserved_9 = (bool)local_a8.cstep._3_1_;
                pLVar3[2].support_reserved_10 = (bool)local_a8.cstep._4_1_;
                pLVar3[2].support_reserved_11 = (bool)local_a8.cstep._5_1_;
                pLVar3[2].support_reserved_12 = (bool)local_a8.cstep._6_1_;
                pLVar3[2].support_reserved_13 = (bool)local_a8.cstep._7_1_;
                local_a8._52_8_ = uVar9;
              }
              if (pMVar14 != (pointer)0x0) {
                LOCK();
                *(int *)&pMVar14->data = *(int *)&pMVar14->data + -1;
                UNLOCK();
                if (*(int *)&pMVar14->data == 0) {
                  if ((pointer)local_a8.allocator == (pointer)0x0) {
                    if ((pointer)local_a8.data != (pointer)0x0) {
                      free(local_a8.data);
                    }
                  }
                  else {
                    (**(code **)((long)(local_a8.allocator)->_vptr_Allocator + 0x18))();
                  }
                }
              }
              uVar12 = *(int *)&pLVar3[2].support_tensor_storage *
                       *(int *)&pLVar3[2].support_reserved_6;
              pMVar14 = pLVar3[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (0 < (int)uVar12) {
                memset(pMVar14,0,(ulong)uVar12 << 2);
              }
            }
            else {
              pMVar14 = pLVar3[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            if (0 < iVar10) {
              sVar15 = pLVar3[1].name.field_2._M_allocated_capacity;
              iVar11._0_1_ = pLVar3[1].one_blob_only;
              iVar11._1_1_ = pLVar3[1].support_inplace;
              iVar11._2_1_ = pLVar3[1].support_vulkan;
              iVar11._3_1_ = pLVar3[1].support_packing;
              iVar13 = (int)((long)iVar11 / (long)iVar10);
              sVar17 = 0;
              do {
                if (0 < iVar13) {
                  uVar16 = 0;
                  do {
                    *(float *)(sVar15 + uVar16 * 4) =
                         local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[sVar17] * *(float *)(sVar15 + uVar16 * 4);
                    uVar16 = uVar16 + 1;
                  } while (((long)iVar11 / (long)iVar10 & 0xffffffffU) != uVar16);
                }
                *(float *)((long)&pMVar14->data + sVar17 * 4) =
                     *(float *)((long)&pMVar14->data + sVar17 * 4) *
                     local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar17] +
                     local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar17];
                sVar17 = sVar17 + 1;
                sVar15 = sVar15 + (long)iVar13 * 4;
              } while (sVar17 != __n);
            }
            if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            iVar10 = *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar10;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar10].producer = (int)lVar18;
            std::__cxx11::string::_M_replace
                      ((ulong)&pLVar6->type,0,(char *)(pLVar6->type)._M_string_length,0x52219a);
          }
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != uVar19 + (uVar19 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_innerproduct_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - BatchNorm to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_innerproduct_batchnorm %s %s\n", innerproduct->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (innerproduct->bias_term == 0)
            {
                // init bias as zero
                innerproduct->bias_term = 1;
                innerproduct->bias_data = ncnn::Mat(channels);
                innerproduct->bias_data.fill(0.f);
            }

            const int weight_per_outch = innerproduct->weight_data_size / channels;

            float* weight = innerproduct->weight_data;
            float* bias = innerproduct->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}